

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> * __thiscall
type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>::
map<C_A_T_C_H_T_E_S_T_0()::functor_t&,int,void,void>
          (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
           *__return_storage_ptr__,
          basic_variant<type_safe::optional_variant_policy,int,double,debugger_type> *this,
          functor_t *f,int *args)

{
  bool bVar1;
  tagged_union<int,_double,_debugger_type> *res;
  tagged_union<int,_double,_debugger_type> *u;
  int *args_local;
  functor_t *f_local;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *this_local;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *result;
  
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::basic_variant();
  bVar1 = basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::has_value
                    ((basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                      *)this);
  if (bVar1) {
    res = detail::variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
          get_union(&__return_storage_ptr__->storage_);
    u = detail::variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
        get_union((variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *
                  )this);
    detail::map_union<functor_t_&,_type_safe::tagged_union<int,_double,_debugger_type>_>::map<int>
              (res,u,f,args);
  }
  return __return_storage_ptr__;
}

Assistant:

basic_variant map(Functor&& f, Args&&... args) const TYPE_SAFE_LVALUE_REF
    {
        basic_variant result(force_empty{});
        if (!has_value())
            return result;
        detail::map_union<Functor&&, union_t>::map(result.storage_.get_union(),
                                                   storage_.get_union(), std::forward<Functor>(f),
                                                   std::forward<Args>(args)...);
        DEBUG_ASSERT(result.has_value(), detail::assert_handler{});
        return result;
    }